

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O3

void duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  UnifiedVectorFormat *pUVar5;
  double *pdVar6;
  list_entry_t *plVar7;
  long lVar8;
  long lVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var11;
  ulong uVar12;
  long lVar13;
  undefined4 uVar15;
  undefined4 uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  byte bVar17;
  double dVar18;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  _Alloc_hider _Var19;
  size_type sVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  char cVar22;
  BoundFunctionExpression *pBVar23;
  reference vector;
  reference vector_00;
  idx_t iVar24;
  idx_t count;
  Vector *pVVar25;
  Vector *vector_01;
  idx_t iVar26;
  TemplatedValidityData<unsigned_long> *pTVar27;
  UnifiedVectorFormat *pUVar28;
  _Head_base<0UL,_unsigned_long_*,_false> _Var29;
  InvalidInputException *pIVar30;
  UnifiedVectorFormat *pUVar31;
  idx_t idx_in_entry;
  ulong uVar32;
  ulong uVar33;
  VectorType VVar34;
  uint64_t *puVar35;
  ulong uVar36;
  long lVar37;
  UnifiedVectorFormat *pUVar38;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t lVar39;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  UnifiedVectorFormat ldata;
  double *rhs_data;
  double *lhs_data;
  uint64_t *local_190;
  string local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  UnifiedVectorFormat *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  DataChunk *local_d8;
  unsigned_long local_d0;
  UnifiedVectorFormat *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  double *local_80;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar23 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pUVar5 = *(UnifiedVectorFormat **)(args + 0x18);
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  local_d8 = args;
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  iVar24 = duckdb::ListVector::GetListSize(vector);
  count = duckdb::ListVector::GetListSize(vector_00);
  pVVar25 = (Vector *)duckdb::ListVector::GetEntry(vector);
  vector_01 = (Vector *)duckdb::ListVector::GetEntry(vector_00);
  duckdb::Vector::Flatten((ulong)pVVar25);
  duckdb::Vector::Flatten((ulong)vector_01);
  FlatVector::VerifyFlatVector(pVVar25);
  iVar26 = TemplatedValidityMask<unsigned_long>::CountValid
                     ((TemplatedValidityMask<unsigned_long> *)(pVVar25 + 0x28),iVar24);
  if (iVar26 != iVar24) {
    pIVar30 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(pBVar23 + 0x60),
               *(long *)(pBVar23 + 0x68) + *(long *)(pBVar23 + 0x60));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar30,&local_138,&local_50)
    ;
    __cxa_throw(pIVar30,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(vector_01);
  iVar24 = TemplatedValidityMask<unsigned_long>::CountValid
                     ((TemplatedValidityMask<unsigned_long> *)(vector_01 + 0x28),count);
  if (iVar24 != count) {
    pIVar30 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)(pBVar23 + 0x60),
               *(long *)(pBVar23 + 0x68) + *(long *)(pBVar23 + 0x60));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar30,&local_138,&local_70)
    ;
    __cxa_throw(pIVar30,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar23 = pBVar23 + 0x60;
  local_78 = *(undefined8 *)(pVVar25 + 0x20);
  local_80 = *(double **)(vector_01 + 0x20);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar34 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar34);
    pdVar6 = *(double **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      fun.lhs_data = (double **)&local_78;
      fun.func_name = (string *)pBVar23;
      fun.rhs_data = &local_80;
      dVar18 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                         (fun,**(list_entry_t **)(vector + 0x20),
                          **(list_entry_t **)(vector_00 + 0x20),(ValidityMask *)(result + 0x28),0);
      *pdVar6 = dVar18;
      goto LAB_0069aff3;
    }
  }
  else {
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      plVar7 = *(list_entry_t **)(vector_00 + 0x20);
      lVar8 = *(long *)(vector + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar34);
        lVar9 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pVVar25 = result + 0x28;
        FlatVector::VerifyFlatVector(vector);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        if (*(long *)(vector + 0x28) == 0) {
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_c8 = pUVar5;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          *(undefined8 *)pVVar25 = 0;
        }
        else {
          local_c8 = pUVar5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_138,(unsigned_long **)(vector + 0x28),
                     (unsigned_long *)&local_c8);
          sVar20 = local_138._M_string_length;
          _Var19._M_p = local_138._M_dataplus._M_p;
          local_138._M_dataplus._M_p = (pointer)0x0;
          local_138._M_string_length = 0;
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(pointer *)(result + 0x30) = _Var19._M_p;
          *(size_type *)(result + 0x38) = sVar20;
          if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar27->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          *(_Head_base<0UL,_unsigned_long_*,_false> *)pVVar25 =
               _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            local_138._M_dataplus._M_p = (pointer)pBVar23;
            local_138._M_string_length = (size_type)&local_78;
            local_138.field_2._M_allocated_capacity = (size_type)&local_80;
            if ((UnifiedVectorFormat *)0x3f < pUVar5 + 0x3f) {
              lVar8 = lVar8 + 8;
              pUVar38 = (UnifiedVectorFormat *)0x0;
              uVar33 = 0;
              do {
                if (*(long *)pVVar25 == 0) {
                  pUVar28 = pUVar38 + 0x40;
                  if (pUVar5 <= pUVar38 + 0x40) {
                    pUVar28 = pUVar5;
                  }
LAB_0069af0b:
                  pUVar31 = pUVar38;
                  if (pUVar38 < pUVar28) {
                    lVar39 = *plVar7;
                    puVar35 = (uint64_t *)((long)pUVar38 * 0x10 + lVar8);
                    do {
                      fun_01.lhs_data = (double **)&local_78;
                      fun_01.func_name = (string *)pBVar23;
                      fun_01.rhs_data = &local_80;
                      left_00.length = *puVar35;
                      left_00.offset = puVar35[-1];
                      dVar18 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_01,left_00,lVar39,(ValidityMask *)pVVar25,
                                          (idx_t)pUVar38);
                      *(double *)(lVar9 + (long)pUVar38 * 8) = dVar18;
                      pUVar38 = pUVar38 + 1;
                      puVar35 = puVar35 + 2;
                      pUVar31 = pUVar28;
                    } while (pUVar28 != pUVar38);
                  }
                }
                else {
                  uVar12 = *(ulong *)(*(long *)pVVar25 + uVar33 * 8);
                  pUVar28 = pUVar38 + 0x40;
                  if (pUVar5 <= pUVar38 + 0x40) {
                    pUVar28 = pUVar5;
                  }
                  pUVar31 = pUVar28;
                  if (uVar12 != 0) {
                    if (uVar12 == 0xffffffffffffffff) goto LAB_0069af0b;
                    pUVar31 = pUVar38;
                    if (pUVar38 < pUVar28) {
                      puVar35 = (uint64_t *)((long)pUVar38 * 0x10 + lVar8);
                      uVar32 = 0;
                      do {
                        if ((uVar12 >> (uVar32 & 0x3f) & 1) != 0) {
                          fun_00.lhs_data = (double **)&local_78;
                          fun_00.func_name = (string *)pBVar23;
                          fun_00.rhs_data = &local_80;
                          left.length = *puVar35;
                          left.offset = puVar35[-1];
                          dVar18 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                             (fun_00,left,*plVar7,(ValidityMask *)pVVar25,
                                              (idx_t)(pUVar38 + uVar32));
                          *(double *)(lVar9 + (long)pUVar38 * 8 + uVar32 * 8) = dVar18;
                        }
                        uVar32 = uVar32 + 1;
                        puVar35 = puVar35 + 2;
                        pUVar31 = pUVar28;
                      } while ((long)pUVar28 - (long)pUVar38 != uVar32);
                    }
                  }
                }
                pUVar38 = pUVar31;
                uVar33 = uVar33 + 1;
              } while (uVar33 != (ulong)(pUVar5 + 0x3f) >> 6);
            }
            goto LAB_0069aff3;
          }
        }
        local_138._M_dataplus._M_p = (pointer)pBVar23;
        local_138._M_string_length = (size_type)&local_78;
        local_138.field_2._M_allocated_capacity = (size_type)&local_80;
        if (pUVar5 != (UnifiedVectorFormat *)0x0) {
          lVar39 = *plVar7;
          local_190 = (uint64_t *)(lVar8 + 8);
          pUVar38 = (UnifiedVectorFormat *)0x0;
          do {
            fun_05.lhs_data = (double **)local_138._M_string_length;
            fun_05.func_name = (string *)local_138._M_dataplus._M_p;
            fun_05.rhs_data = (double **)local_138.field_2._M_allocated_capacity;
            left_02.length = *local_190;
            left_02.offset = local_190[-1];
            dVar18 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                               (fun_05,left_02,lVar39,(ValidityMask *)pVVar25,(idx_t)pUVar38);
            *(double *)(lVar9 + (long)pUVar38 * 8) = dVar18;
            pUVar38 = pUVar38 + 1;
            local_190 = local_190 + 2;
          } while (pUVar5 != pUVar38);
        }
        goto LAB_0069aff3;
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 != (value_type)0x0 || vVar1 != (value_type)0x0) {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_138);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c8);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar5);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar5);
          duckdb::Vector::SetVectorType(VVar34);
          p_Var10 = p_Stack_c0;
          pUVar38 = local_c8;
          sVar20 = local_138._M_string_length;
          _Var19._M_p = local_138._M_dataplus._M_p;
          lVar8 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pVVar25 = result + 0x28;
          if (local_b8 == 0 && (double **)local_138.field_2._M_allocated_capacity == (double **)0x0)
          {
            if (pUVar5 != (UnifiedVectorFormat *)0x0) {
              lVar9 = *(long *)_Var19._M_p;
              lVar13 = *(long *)pUVar38;
              pUVar38 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar28 = pUVar38;
                if (lVar9 != 0) {
                  pUVar28 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar9 + (long)pUVar38 * 4);
                }
                pUVar31 = pUVar38;
                if (lVar13 != 0) {
                  pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar13 + (long)pUVar38 * 4);
                }
                uVar3 = p_Var10[(long)pUVar31]._M_use_count;
                uVar15 = p_Var10[(long)pUVar31]._M_weak_count;
                right.length._4_4_ = uVar15;
                right.length._0_4_ = uVar3;
                fun_02.lhs_data = (double **)&local_78;
                fun_02.func_name = (string *)pBVar23;
                fun_02.rhs_data = &local_80;
                right.offset = (uint64_t)p_Var10[(long)pUVar31]._vptr__Sp_counted_base;
                left_01.length = *(uint64_t *)(sVar20 + ((long)pUVar28 * 2 + 1) * 8);
                left_01.offset = *(uint64_t *)(sVar20 + (long)pUVar28 * 2 * 8);
                dVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_02,left_01,right,(ValidityMask *)pVVar25,(idx_t)pUVar38);
                *(double *)(lVar8 + (long)pUVar38 * 8) = dVar18;
                pUVar38 = pUVar38 + 1;
              } while (pUVar5 != pUVar38);
            }
          }
          else if (pUVar5 != (UnifiedVectorFormat *)0x0) {
            lVar9 = *(long *)_Var19._M_p;
            lVar13 = *(long *)pUVar38;
            pUVar38 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar28 = pUVar38;
              if (lVar9 != 0) {
                pUVar28 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar9 + (long)pUVar38 * 4);
              }
              pUVar31 = pUVar38;
              if (lVar13 != 0) {
                pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar13 + (long)pUVar38 * 4);
              }
              if ((((double **)local_138.field_2._M_allocated_capacity == (double **)0x0) ||
                  (((ulong)*(double **)
                            (local_138.field_2._M_allocated_capacity + ((ulong)pUVar28 >> 6) * 8) >>
                    ((ulong)pUVar28 & 0x3f) & 1) != 0)) &&
                 ((local_b8 == 0 ||
                  ((*(ulong *)(local_b8 + ((ulong)pUVar31 >> 6) * 8) >> ((ulong)pUVar31 & 0x3f) & 1)
                   != 0)))) {
                uVar4 = p_Var10[(long)pUVar31]._M_use_count;
                uVar16 = p_Var10[(long)pUVar31]._M_weak_count;
                lVar39.length._4_4_ = uVar16;
                lVar39.length._0_4_ = uVar4;
                fun_06.lhs_data = (double **)&local_78;
                fun_06.func_name = (string *)pBVar23;
                fun_06.rhs_data = &local_80;
                lVar39.offset = (uint64_t)p_Var10[(long)pUVar31]._vptr__Sp_counted_base;
                left_03.length = *(uint64_t *)(sVar20 + ((long)pUVar28 * 2 + 1) * 8);
                left_03.offset = *(uint64_t *)(sVar20 + (long)pUVar28 * 2 * 8);
                dVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_06,left_03,lVar39,(ValidityMask *)pVVar25,(idx_t)pUVar38);
                *(double *)(lVar8 + (long)pUVar38 * 8) = dVar18;
              }
              else {
                _Var29._M_head_impl = *(unsigned_long **)pVVar25;
                if (_Var29._M_head_impl == (unsigned_long *)0x0) {
                  local_d0 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var21 = p_Stack_e0;
                  pUVar28 = local_e8;
                  local_e8 = (UnifiedVectorFormat *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(UnifiedVectorFormat **)(result + 0x30) = pUVar28;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var21;
                  if ((p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  _Var29._M_head_impl =
                       (pTVar27->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)pVVar25 = _Var29._M_head_impl;
                }
                bVar17 = (byte)pUVar38 & 0x3f;
                _Var29._M_head_impl[(ulong)pUVar38 >> 6] =
                     _Var29._M_head_impl[(ulong)pUVar38 >> 6] &
                     (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
              }
              pUVar38 = pUVar38 + 1;
            } while (pUVar5 != pUVar38);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
          }
          if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
          }
          goto LAB_0069aff3;
        }
        lVar8 = *(long *)(vector + 0x20);
        lVar9 = *(long *)(vector_00 + 0x20);
        local_138._M_dataplus._M_p = (pointer)pBVar23;
        local_138._M_string_length = (size_type)&local_78;
        local_138.field_2._M_allocated_capacity = (size_type)&local_80;
        duckdb::Vector::SetVectorType(VVar34);
        lVar13 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pVVar25 = result + 0x28;
        FlatVector::VerifyFlatVector(vector);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        local_e8 = pUVar5;
        if (*(long *)(vector + 0x28) == 0) {
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          *(undefined8 *)pVVar25 = 0;
LAB_0069b7e0:
          FlatVector::VerifyFlatVector(vector_00);
          *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
          if (*(long *)(vector_00 + 0x28) == 0) {
            p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = 0;
            *(undefined8 *)(result + 0x38) = 0;
            local_e8 = pUVar5;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            _Var29._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_e8 = pUVar5;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)(vector_00 + 0x28),
                       (unsigned_long *)&local_e8);
            p_Var14 = p_Stack_c0;
            pUVar38 = local_c8;
            local_c8 = (UnifiedVectorFormat *)0x0;
            p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar38;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var14;
            if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10),
               p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
            }
            pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var29._M_head_impl =
                 (pTVar27->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          *(unsigned_long **)pVVar25 = _Var29._M_head_impl;
        }
        else {
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)(vector + 0x28),
                     (unsigned_long *)&local_e8);
          p_Var14 = p_Stack_c0;
          pUVar38 = local_c8;
          local_c8 = (UnifiedVectorFormat *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(UnifiedVectorFormat **)(result + 0x30) = pUVar38;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var14;
          if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10),
             p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar27->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          *(_Head_base<0UL,_unsigned_long_*,_false> *)pVVar25 =
               _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ==
              (unsigned_long *)0x0) goto LAB_0069b7e0;
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)pVVar25,(ulong)(vector_00 + 0x28));
          _Var29._M_head_impl = *(unsigned_long **)pVVar25;
        }
        if (_Var29._M_head_impl == (unsigned_long *)0x0) {
          if (pUVar5 != (UnifiedVectorFormat *)0x0) {
            lVar37 = 1;
            pUVar38 = (UnifiedVectorFormat *)0x0;
            do {
              fun_10.lhs_data = (double **)local_138._M_string_length;
              fun_10.func_name = (string *)local_138._M_dataplus._M_p;
              fun_10.rhs_data = (double **)local_138.field_2._M_allocated_capacity;
              right_05.length = *(uint64_t *)(lVar9 + lVar37 * 8);
              right_05.offset = *(uint64_t *)(lVar9 + -8 + lVar37 * 8);
              left_06.length = *(uint64_t *)(lVar8 + lVar37 * 8);
              left_06.offset = *(uint64_t *)(lVar8 + -8 + lVar37 * 8);
              dVar18 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_10,left_06,right_05,(ValidityMask *)pVVar25,(idx_t)pUVar38);
              *(double *)(lVar13 + (long)pUVar38 * 8) = dVar18;
              pUVar38 = pUVar38 + 1;
              lVar37 = lVar37 + 2;
            } while (pUVar5 != pUVar38);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar5 + 0x3f) {
          uVar33 = 0;
          pUVar38 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)pVVar25 == 0) {
              pUVar28 = pUVar38 + 0x40;
              if (pUVar5 <= pUVar38 + 0x40) {
                pUVar28 = pUVar5;
              }
LAB_0069b98a:
              pUVar31 = pUVar38;
              if (pUVar38 < pUVar28) {
                lVar37 = (long)pUVar38 * 2 + 1;
                do {
                  fun_09.lhs_data = (double **)local_138._M_string_length;
                  fun_09.func_name = (string *)local_138._M_dataplus._M_p;
                  fun_09.rhs_data = (double **)local_138.field_2._M_allocated_capacity;
                  right_04.length = *(uint64_t *)(lVar9 + lVar37 * 8);
                  right_04.offset = *(uint64_t *)(lVar9 + -8 + lVar37 * 8);
                  left_05.length = *(uint64_t *)(lVar8 + lVar37 * 8);
                  left_05.offset = *(uint64_t *)(lVar8 + -8 + lVar37 * 8);
                  dVar18 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                     (fun_09,left_05,right_04,(ValidityMask *)pVVar25,(idx_t)pUVar38
                                     );
                  *(double *)(lVar13 + (long)pUVar38 * 8) = dVar18;
                  pUVar38 = pUVar38 + 1;
                  lVar37 = lVar37 + 2;
                  pUVar31 = pUVar28;
                } while (pUVar28 != pUVar38);
              }
            }
            else {
              uVar12 = *(ulong *)(*(long *)pVVar25 + uVar33 * 8);
              pUVar28 = pUVar38 + 0x40;
              if (pUVar5 <= pUVar38 + 0x40) {
                pUVar28 = pUVar5;
              }
              pUVar31 = pUVar28;
              if (uVar12 != 0) {
                if (uVar12 == 0xffffffffffffffff) goto LAB_0069b98a;
                pUVar31 = pUVar38;
                if (pUVar38 < pUVar28) {
                  uVar32 = (long)pUVar38 << 4 | 8;
                  uVar36 = 0;
                  do {
                    if ((uVar12 >> (uVar36 & 0x3f) & 1) != 0) {
                      fun_08.lhs_data = (double **)local_138._M_string_length;
                      fun_08.func_name = (string *)local_138._M_dataplus._M_p;
                      fun_08.rhs_data = (double **)local_138.field_2._M_allocated_capacity;
                      right_03.length = *(uint64_t *)(lVar9 + uVar32);
                      right_03.offset = *(uint64_t *)(lVar9 + -8 + uVar32);
                      left_04.length = *(uint64_t *)(lVar8 + uVar32);
                      left_04.offset = *(uint64_t *)(lVar8 + -8 + uVar32);
                      dVar18 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_08,left_04,right_03,(ValidityMask *)pVVar25,
                                          (idx_t)(pUVar38 + uVar36));
                      *(double *)(lVar13 + (long)pUVar38 * 8 + uVar36 * 8) = dVar18;
                    }
                    uVar36 = uVar36 + 1;
                    uVar32 = uVar32 + 0x10;
                    pUVar31 = pUVar28;
                  } while ((long)pUVar28 - (long)pUVar38 != uVar36);
                }
              }
            }
            uVar33 = uVar33 + 1;
            pUVar38 = pUVar31;
          } while (uVar33 != (ulong)(pUVar5 + 0x3f) >> 6);
        }
        goto LAB_0069aff3;
      }
      plVar7 = *(list_entry_t **)(vector + 0x20);
      lVar8 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar34);
        lVar9 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pVVar25 = result + 0x28;
        FlatVector::VerifyFlatVector(vector_00);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        if (*(long *)(vector_00 + 0x28) == 0) {
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_c8 = pUVar5;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          *(undefined8 *)pVVar25 = 0;
        }
        else {
          local_c8 = pUVar5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_138,(unsigned_long **)(vector_00 + 0x28),
                     (unsigned_long *)&local_c8);
          sVar20 = local_138._M_string_length;
          _Var19._M_p = local_138._M_dataplus._M_p;
          local_138._M_dataplus._M_p = (pointer)0x0;
          local_138._M_string_length = 0;
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(pointer *)(result + 0x30) = _Var19._M_p;
          *(size_type *)(result + 0x38) = sVar20;
          if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar27->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          *(_Head_base<0UL,_unsigned_long_*,_false> *)pVVar25 =
               _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            local_138._M_dataplus._M_p = (pointer)pBVar23;
            local_138._M_string_length = (size_type)&local_78;
            local_138.field_2._M_allocated_capacity = (size_type)&local_80;
            if ((UnifiedVectorFormat *)0x3f < pUVar5 + 0x3f) {
              lVar8 = lVar8 + 8;
              pUVar38 = (UnifiedVectorFormat *)0x0;
              uVar33 = 0;
              do {
                if (*(long *)pVVar25 == 0) {
                  pUVar28 = pUVar38 + 0x40;
                  if (pUVar5 <= pUVar38 + 0x40) {
                    pUVar28 = pUVar5;
                  }
LAB_0069b300:
                  pUVar31 = pUVar38;
                  if (pUVar38 < pUVar28) {
                    lVar39 = *plVar7;
                    puVar35 = (uint64_t *)((long)pUVar38 * 0x10 + lVar8);
                    do {
                      fun_04.lhs_data = (double **)&local_78;
                      fun_04.func_name = (string *)pBVar23;
                      fun_04.rhs_data = &local_80;
                      right_01.length = *puVar35;
                      right_01.offset = puVar35[-1];
                      dVar18 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_04,lVar39,right_01,(ValidityMask *)pVVar25,
                                          (idx_t)pUVar38);
                      *(double *)(lVar9 + (long)pUVar38 * 8) = dVar18;
                      pUVar38 = pUVar38 + 1;
                      puVar35 = puVar35 + 2;
                      pUVar31 = pUVar28;
                    } while (pUVar28 != pUVar38);
                  }
                }
                else {
                  uVar12 = *(ulong *)(*(long *)pVVar25 + uVar33 * 8);
                  pUVar28 = pUVar38 + 0x40;
                  if (pUVar5 <= pUVar38 + 0x40) {
                    pUVar28 = pUVar5;
                  }
                  pUVar31 = pUVar28;
                  if (uVar12 != 0) {
                    if (uVar12 == 0xffffffffffffffff) goto LAB_0069b300;
                    pUVar31 = pUVar38;
                    if (pUVar38 < pUVar28) {
                      puVar35 = (uint64_t *)((long)pUVar38 * 0x10 + lVar8);
                      uVar32 = 0;
                      do {
                        if ((uVar12 >> (uVar32 & 0x3f) & 1) != 0) {
                          fun_03.lhs_data = (double **)&local_78;
                          fun_03.func_name = (string *)pBVar23;
                          fun_03.rhs_data = &local_80;
                          right_00.length = *puVar35;
                          right_00.offset = puVar35[-1];
                          dVar18 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                             (fun_03,*plVar7,right_00,(ValidityMask *)pVVar25,
                                              (idx_t)(pUVar38 + uVar32));
                          *(double *)(lVar9 + (long)pUVar38 * 8 + uVar32 * 8) = dVar18;
                        }
                        uVar32 = uVar32 + 1;
                        puVar35 = puVar35 + 2;
                        pUVar31 = pUVar28;
                      } while ((long)pUVar28 - (long)pUVar38 != uVar32);
                    }
                  }
                }
                pUVar38 = pUVar31;
                uVar33 = uVar33 + 1;
              } while (uVar33 != (ulong)(pUVar5 + 0x3f) >> 6);
            }
            goto LAB_0069aff3;
          }
        }
        local_138._M_dataplus._M_p = (pointer)pBVar23;
        local_138._M_string_length = (size_type)&local_78;
        local_138.field_2._M_allocated_capacity = (size_type)&local_80;
        if (pUVar5 != (UnifiedVectorFormat *)0x0) {
          lVar39 = *plVar7;
          local_190 = (uint64_t *)(lVar8 + 8);
          pUVar38 = (UnifiedVectorFormat *)0x0;
          do {
            fun_07.lhs_data = (double **)local_138._M_string_length;
            fun_07.func_name = (string *)local_138._M_dataplus._M_p;
            fun_07.rhs_data = (double **)local_138.field_2._M_allocated_capacity;
            right_02.length = *local_190;
            right_02.offset = local_190[-1];
            dVar18 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                               (fun_07,lVar39,right_02,(ValidityMask *)pVVar25,(idx_t)pUVar38);
            *(double *)(lVar9 + (long)pUVar38 * 8) = dVar18;
            pUVar38 = pUVar38 + 1;
            local_190 = local_190 + 2;
          } while (pUVar5 != pUVar38);
        }
        goto LAB_0069aff3;
      }
    }
    duckdb::Vector::SetVectorType(VVar34);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_0069aff3:
  cVar22 = duckdb::DataChunk::AllConstant();
  if (cVar22 != '\0') {
    duckdb::Vector::SetVectorType(VVar34);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}